

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O1

int __thiscall crnlib::qdxt1::init(qdxt1 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar5;
  dxt_pixel_block *pdVar6;
  uint *puVar7;
  uint *puVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  crn_thread_id_t cVar12;
  ulong uVar13;
  void *in_RCX;
  uint uVar14;
  uint uVar15;
  dxt_pixel_block *in_RDX;
  long lVar16;
  uint e;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uchar *puVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint x;
  long lVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  float *pfVar31;
  undefined4 *puVar32;
  float fVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  double dVar36;
  double dVar37;
  color_quad_u8 h;
  training_vec_array *training_vecs;
  color_quad_u8 c [4];
  uint encoding_hist [8];
  color_quad_u8 layout_pixels [64];
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  selector_hash;
  color_quad_u8 chunk_pixels [64];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5fc;
  uint *local_5f8;
  uint local_5ec;
  uint local_5e8;
  float local_5e4;
  ulong local_5e0;
  clusterizer<crnlib::vec<6U,_float>_> *local_5d8;
  mip_desc *local_5d0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5c8 [4];
  ulong local_5b8;
  ulong local_5b0;
  ulong local_5a8;
  long local_5a0;
  double local_598;
  uint local_58c;
  mip_desc *local_588;
  ulong local_580;
  ulong local_578;
  ulong local_570;
  ulong local_568;
  undefined4 *local_560;
  uint *local_558;
  undefined4 *local_550;
  ulong local_548;
  long local_540;
  ulong local_538;
  ulong local_530;
  uint local_528 [8];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_508 [64];
  undefined1 local_408 [4];
  float afStack_404 [5];
  undefined8 local_3f0;
  long local_3c0 [81];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_138 [66];
  
  clear(this);
  cVar12 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar12;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x630);
  local_5d8 = &this->m_endpoint_clusterizer;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::reserve
            (&local_5d8->m_training_vecs,(uint)ctx);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  if (((this->m_params).m_hierarchical == true) && ((this->m_params).m_num_mips != 0)) {
    uVar18 = this->m_num_blocks;
    uVar23 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
    if (uVar23 != uVar18) {
      if (uVar23 <= uVar18) {
        if ((this->m_endpoint_clusterizer).m_training_vecs.m_capacity < uVar18) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_5d8,uVar18,uVar23 + 1 == uVar18,0x1c,
                     vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover,false);
        }
        uVar23 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
        uVar14 = uVar18 - uVar23;
        if (uVar14 != 0) {
          ppVar5 = (this->m_endpoint_clusterizer).m_training_vecs.m_p;
          lVar16 = 0;
          do {
            *(undefined4 *)((long)(&ppVar5[uVar23].first + 1) + lVar16) = 0;
            lVar16 = lVar16 + 0x1c;
          } while ((ulong)uVar14 * 0x1c != lVar16);
        }
      }
      (this->m_endpoint_clusterizer).m_training_vecs.m_size = uVar18;
    }
    local_528[4] = 0;
    local_528[5] = 0;
    local_528[6] = 0;
    local_528[7] = 0;
    local_528[0] = 0;
    local_528[1] = 0;
    local_528[2] = 0;
    local_528[3] = 0;
    if ((this->m_params).m_num_mips != 0) {
      local_588 = (this->m_params).m_mip_desc;
      local_5e8 = 0x200;
      uVar13 = 0;
      local_560 = &DAT_001cf674;
      uVar18 = 0;
      do {
        uVar15 = local_588[uVar13].m_block_width;
        uVar2 = local_588[uVar13].m_block_height;
        local_5e4 = 1.5;
        if (uVar13 != 0) {
          fVar33 = powf(3.1,(float)(uVar13 & 0xffffffff));
          local_5e4 = 0.25;
          if (0.25 <= 1.5 / fVar33) {
            local_5e4 = 1.5 / fVar33;
          }
        }
        uVar14 = uVar2 + 1;
        uVar23 = 5;
        local_5e0 = uVar13;
        if (1 < uVar14) {
          local_5d0 = local_588 + uVar13;
          uVar1 = uVar15 + 1;
          local_58c = uVar1;
          local_548 = (ulong)(uVar2 * 4 - 1);
          uVar17 = (ulong)(uVar15 * 4 - 1);
          local_568 = (ulong)(uVar1 >> 1);
          local_570 = (ulong)(uVar14 >> 1);
          local_5b0 = 0;
          local_5b8 = 0;
          local_580 = uVar17;
          do {
            local_5ec = 8;
            bVar9 = 1 < uVar1;
            if (1 < local_58c) {
              local_540 = local_5b8 * 8;
              local_530 = (ulong)(uint)((int)local_5b8 * 2);
              local_5a8 = 0;
              lVar16 = 0;
              uVar28 = 0;
              do {
                local_578 = uVar28;
                uVar15 = local_5d0->m_first_block;
                uVar2 = local_5d0->m_block_width;
                pdVar6 = this->m_pBlocks;
                puVar20 = &local_138[0].field_0.a;
                lVar22 = 0;
                do {
                  uVar23 = (int)local_540 + (int)lVar22;
                  if ((uint)local_548 <= uVar23) {
                    uVar23 = (uint)local_548;
                  }
                  uVar13 = (ulong)((uVar23 & 3) << 4);
                  lVar25 = 0;
                  do {
                    uVar14 = (int)lVar16 + (int)lVar25;
                    uVar28 = (ulong)uVar14;
                    if ((uint)uVar17 <= uVar14) {
                      uVar28 = uVar17 & 0xffffffff;
                    }
                    uVar14 = (int)(uVar28 >> 2) + (uVar23 >> 2) * uVar2 + uVar15;
                    uVar26 = (uint)uVar28 & 3;
                    puVar20[lVar25 * 4 + -3] = pdVar6[uVar14].m_pixels[0][uVar26].field_0.c[uVar13];
                    puVar20[lVar25 * 4 + -2] =
                         pdVar6[uVar14].m_pixels[0][uVar26].field_0.c[uVar13 + 1];
                    puVar20[lVar25 * 4 + -1] =
                         pdVar6[uVar14].m_pixels[0][uVar26].field_0.c[uVar13 + 2];
                    puVar20[lVar25 * 4] = pdVar6[uVar14].m_pixels[0][uVar26].field_0.c[uVar13 + 3];
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 8);
                  lVar22 = lVar22 + 1;
                  puVar20 = puVar20 + 0x20;
                } while (lVar22 != 8);
                local_5a0 = lVar16;
                pfVar31 = afStack_404 + 1;
                lVar16 = 0;
                do {
                  uVar23 = (&DAT_001cf908)[lVar16 * 5];
                  iVar11 = (&DAT_001cf90c)[lVar16 * 5];
                  if (iVar11 != 0) {
                    uVar14 = (&g_chunk_tile_layouts)[lVar16 * 5] + (&DAT_001cf904)[lVar16 * 5] * 8;
                    uVar19 = 0;
                    iVar21 = 0;
                    uVar13 = (ulong)uVar23;
                    uVar26 = uVar14;
                    uVar24 = uVar19;
                    do {
                      for (; uVar13 != 0; uVar13 = uVar13 - 1) {
                        local_508[uVar19] = local_138[uVar14];
                        uVar19 = uVar19 + 1;
                        uVar14 = uVar14 + 1;
                      }
                      iVar21 = iVar21 + 1;
                      uVar19 = uVar24 + uVar23;
                      uVar14 = uVar26 + 8;
                      uVar13 = (ulong)uVar23;
                      uVar26 = uVar14;
                      uVar24 = uVar19;
                    } while (iVar21 != iVar11);
                  }
                  uVar23 = iVar11 * uVar23;
                  lVar22 = lVar16 * 0x50;
                  local_5f8 = (uint *)lVar16;
                  dxt_fast::compress_color_block
                            (uVar23,(color_quad_u8 *)&local_508[0].field_0,
                             (uint *)(local_408 + lVar22),(uint *)(local_408 + lVar22 + 4),
                             (uint8 *)(afStack_404 + lVar16 * 0x14U + 1),false);
                  dxt1_block::get_block_colors
                            ((color_quad_u8 *)&local_5c8[0].field_0,
                             (uint16)*(uint *)(local_408 + lVar22),
                             *(uint16 *)(local_408 + lVar22 + 4));
                  if (uVar23 == 0) {
                    lVar22 = 0;
                  }
                  else {
                    uVar13 = 0;
                    lVar22 = 0;
                    do {
                      uVar17 = (ulong)*(byte *)((long)pfVar31 + uVar13);
                      lVar22 = lVar22 + (ulong)(((uint)local_508[0].c[uVar13 * 4 + 2] -
                                                (uint)local_5c8[0].c[uVar17 * 4 + 2]) *
                                                ((uint)local_508[0].c[uVar13 * 4 + 2] -
                                                (uint)local_5c8[0].c[uVar17 * 4 + 2]) +
                                               ((uint)local_508[0].c[uVar13 * 4 + 1] -
                                               (uint)local_5c8[0].c[uVar17 * 4 + 1]) *
                                               ((uint)local_508[0].c[uVar13 * 4 + 1] -
                                               (uint)local_5c8[0].c[uVar17 * 4 + 1]) +
                                               ((uint)local_508[0].c[uVar13 * 4] -
                                               (uint)local_5c8[0].c[uVar17 * 4]) *
                                               ((uint)local_508[0].c[uVar13 * 4] -
                                               (uint)local_5c8[0].c[uVar17 * 4]));
                      uVar13 = uVar13 + 1;
                    } while (uVar23 != uVar13);
                  }
                  local_3c0[lVar16 * 10] = lVar22;
                  lVar16 = (long)local_5f8 + 1;
                  pfVar31 = pfVar31 + 0x14;
                } while (lVar16 != 9);
                uVar17 = 0;
                puVar8 = (uint *)0xbff0000000000000;
                uVar13 = 0;
                puVar32 = local_560;
                do {
                  if ((ulong)(uint)(&g_chunk_encodings)[uVar17 * 0x15] == 0) {
                    dVar37 = 0.0;
                  }
                  else {
                    dVar37 = 0.0;
                    lVar16 = 0;
                    do {
                      dVar37 = dVar37 + ((double)CONCAT44(0x45300000,
                                                          (int)((ulong)local_3c0[(ulong)*(uint *)((
                                                  long)puVar32 + lVar16) * 10] >> 0x20)) -
                                        1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,
                                                          (int)local_3c0[(ulong)*(uint *)((long)
                                                  puVar32 + lVar16) * 10]) - 4503599627370496.0);
                      lVar16 = lVar16 + 0x14;
                    } while ((ulong)(uint)(&g_chunk_encodings)[uVar17 * 0x15] * 0x14 != lVar16);
                    dVar37 = dVar37 * 0.0052083334885537624;
                  }
                  local_5f8 = puVar8;
                  if (dVar37 < 0.0) {
                    local_598 = dVar37;
                    dVar36 = sqrt(dVar37);
                    dVar37 = local_598;
                  }
                  else {
                    dVar36 = SQRT(dVar37);
                  }
                  uVar34 = 0;
                  uVar35 = 0x412e847e;
                  if ((dVar37 != 0.0) || (NAN(dVar37))) {
                    dVar37 = log10(255.0 / dVar36);
                    dVar37 = dVar37 * 20.0;
                    dVar36 = 500.0;
                    if (dVar37 <= 500.0) {
                      dVar36 = dVar37;
                    }
                    uVar28 = ~-(ulong)(dVar37 < 0.0) & (ulong)dVar36;
                    uVar34 = (undefined4)uVar28;
                    uVar35 = (undefined4)(uVar28 >> 0x20);
                  }
                  puVar7 = (uint *)((double)CONCAT44(uVar35,uVar34) -
                                   (double)(((float)((&g_chunk_encodings)[uVar17 * 0x15] - 1) / 3.0)
                                            * local_5e4 + 0.0));
                  puVar8 = local_5f8;
                  if ((double)local_5f8 < (double)puVar7) {
                    uVar13 = uVar17 & 0xffffffff;
                    puVar8 = puVar7;
                  }
                  uVar17 = uVar17 + 1;
                  puVar32 = puVar32 + 0x15;
                } while (uVar17 != 8);
                local_528[uVar13] = local_528[uVar13] + 1;
                lVar16 = local_5a0;
                if ((&g_chunk_encodings)[uVar13 * 0x15] != 0) {
                  local_550 = &DAT_001cf664 + uVar13 * 0x15;
                  uVar17 = 0;
                  local_558 = &g_chunk_encodings + uVar13 * 0x15;
                  do {
                    local_538 = uVar17;
                    puVar8 = local_550 + uVar17 * 5;
                    uVar23 = puVar8[3];
                    if (uVar23 != 0) {
                      uVar14 = puVar8[2];
                      iVar11 = puVar8[1] << 3;
                      uVar13 = 0;
                      uVar26 = 0;
                      do {
                        iVar21 = (int)uVar13;
                        if ((ulong)uVar14 != 0) {
                          uVar19 = *puVar8 + iVar11;
                          uVar17 = (ulong)uVar14;
                          do {
                            local_508[uVar13] = local_138[uVar19];
                            uVar13 = (ulong)((int)uVar13 + 1);
                            uVar19 = uVar19 + 1;
                            uVar17 = uVar17 - 1;
                          } while (uVar17 != 0);
                        }
                        uVar26 = uVar26 + 1;
                        uVar13 = (ulong)(iVar21 + uVar14);
                        iVar11 = iVar11 + 8;
                      } while (uVar26 != uVar23);
                    }
                    dxt_fast::find_representative_colors
                              (uVar23 * puVar8[2],(color_quad_u8 *)&local_508[0].field_0,
                               (color_quad_u8 *)&local_5c8[0].field_0,
                               (color_quad_u8 *)&local_5fc.field_0);
                    iVar11 = (uint)(byte)local_5c8[0]._0_1_ - (uint)local_5fc.field_0.r;
                    iVar21 = (uint)(byte)local_5c8[0]._1_1_ - (uint)local_5fc.field_0.g;
                    iVar27 = (uint)(byte)local_5c8[0]._2_1_ - (uint)local_5fc.field_0.b;
                    uVar14 = iVar27 * iVar27 + iVar21 * iVar21 + iVar11 * iVar11;
                    uVar23 = (uint)((ulong)uVar14 * 0x68db8bad >> 0x2b);
                    if (7 < uVar23) {
                      uVar23 = 8;
                    }
                    if (uVar14 < 5000) {
                      uVar23 = 1;
                    }
                    uVar14 = puVar8[3];
                    if (3 < uVar14) {
                      uVar26 = puVar8[1];
                      uVar19 = local_5d0->m_block_height;
                      local_598 = (double)CONCAT44(local_598._4_4_,uVar19);
                      iVar11 = (int)local_5b0 + (uVar26 >> 2);
                      uVar24 = 0;
                      do {
                        if ((uVar24 + (int)local_530 + (uVar26 >> 2) < uVar19) &&
                           (uVar3 = puVar8[2], 3 < uVar3)) {
                          uVar4 = local_5d0->m_block_width;
                          ppVar5 = (local_5d8->m_training_vecs).m_p;
                          iVar21 = (*puVar8 >> 2) + (int)local_5a8;
                          uVar30 = 0;
                          do {
                            if (uVar4 <= iVar21 + uVar30) break;
                            uVar29 = uVar30 + uVar4 * iVar11 + iVar21 + local_5d0->m_first_block;
                            ppVar5[uVar29].first.m_s[0] = (float)(byte)local_5c8[0]._0_1_;
                            ppVar5[uVar29].first.m_s[1] = (float)(byte)local_5c8[0]._1_1_;
                            ppVar5[uVar29].first.m_s[2] = (float)(byte)local_5c8[0]._2_1_;
                            ppVar5[uVar29].first.m_s[3] = (float)local_5fc._0_1_;
                            ppVar5[uVar29].first.m_s[4] = (float)local_5fc._1_1_;
                            ppVar5[uVar29].first.m_s[5] = (float)local_5fc._2_1_;
                            ppVar5[uVar29].second = uVar23;
                            uVar18 = uVar18 + 1;
                            uVar30 = uVar30 + 1;
                          } while (uVar30 < uVar3 >> 2);
                        }
                        uVar24 = uVar24 + 1;
                        iVar11 = iVar11 + 1;
                        lVar16 = local_5a0;
                        local_5f8 = puVar8;
                      } while (uVar24 != uVar14 >> 2);
                    }
                    uVar17 = local_538 + 1;
                  } while (uVar17 < *local_558);
                }
                bVar10 = true;
                if (local_5e8 <= uVar18) {
                  bVar10 = update_progress(this,uVar18,this->m_num_blocks - 1);
                  local_5e8 = local_5e8 + 0x200;
                }
                uVar13 = local_5e0;
                uVar17 = local_580;
                if (bVar10 == false) {
                  local_5ec = 1;
                  break;
                }
                uVar28 = local_578 + 1;
                bVar9 = uVar28 < local_568;
                lVar16 = lVar16 + 8;
                local_5a8 = (ulong)((int)local_5a8 + 2);
              } while (uVar28 != local_568);
            }
            uVar23 = local_5ec;
            if (bVar9) goto LAB_001377f6;
            local_5b8 = local_5b8 + 1;
            local_5b0 = (ulong)((int)local_5b0 + 2);
          } while (local_5b8 != local_570);
          uVar23 = 5;
        }
LAB_001377f6:
        if (uVar23 != 5) {
          if ((uVar23 & 0xd) != 0) {
            return 0;
          }
          break;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (this->m_params).m_num_mips);
    }
  }
  else {
    uVar13 = (ulong)this->m_num_blocks;
    if (this->m_num_blocks != 0) {
      lVar16 = 0;
      uVar17 = 0;
      do {
        if (((uVar17 & 0x1ff) == 0) &&
           (bVar9 = update_progress(this,(uint)uVar17,(int)uVar13 - 1), !bVar9)) {
          return 0;
        }
        dxt_fast::find_representative_colors
                  (0x10,(color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar16),
                   (color_quad_u8 *)&local_138[0].field_0,(color_quad_u8 *)&local_508[0].field_0);
        iVar11 = (uint)(byte)local_138[0]._0_1_ - (uint)(byte)local_508[0]._0_1_;
        iVar27 = (uint)(byte)local_138[0]._1_1_ - (uint)(byte)local_508[0]._1_1_;
        iVar21 = (uint)(byte)local_138[0]._2_1_ - (uint)(byte)local_508[0]._2_1_;
        uVar23 = iVar21 * iVar21 + iVar27 * iVar27 + iVar11 * iVar11;
        uVar18 = (uint)((ulong)uVar23 * 0x68db8bad >> 0x20);
        uVar15 = uVar18 >> 0xb;
        if (7 < uVar18 >> 0xb) {
          uVar15 = 8;
        }
        if (uVar23 < 5000) {
          uVar15 = 1;
        }
        _local_408 = (raw_node *)
                     CONCAT44((float)(byte)local_138[0]._1_1_,(float)(byte)local_138[0]._0_1_);
        afStack_404[2] = (float)(byte)local_508[0]._0_1_;
        afStack_404[1] = (float)(byte)local_138[0]._2_1_;
        afStack_404[3] = (float)(byte)local_508[0]._1_1_;
        afStack_404[4] = (float)(byte)local_508[0]._2_1_;
        clusterizer<crnlib::vec<6U,_float>_>::add_training_vec
                  (local_5d8,(vec<6U,_float> *)local_408,uVar15);
        uVar17 = uVar17 + 1;
        uVar13 = (ulong)this->m_num_blocks;
        lVar16 = lVar16 + 0x40;
      } while (uVar17 < uVar13);
    }
  }
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  uVar18 = 0;
  bVar9 = clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                    (local_5d8,0xffff,generate_codebook_progress_callback,this,false);
  if (bVar9) {
    _local_408 = (raw_node *)0x0;
    afStack_404[1] = 0.0;
    afStack_404[2] = 0.0;
    afStack_404[3] = 4.48416e-44;
    local_3f0._0_4_ = 0;
    local_3f0._4_4_ = 0;
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    uVar13 = (ulong)this->m_num_blocks;
    bVar9 = this->m_num_blocks == 0;
    if (!bVar9) {
      lVar16 = 0;
      uVar17 = 0;
      do {
        if (((uVar17 & 0x1ff) == 0) &&
           (bVar10 = update_progress(this,(uint)uVar17,(int)uVar13 - 1), !bVar10))
        goto LAB_00137a9d;
        dxt_fast::compress_color_block
                  ((dxt1_block *)&local_508[0].field_0,
                   (color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar16),false)
        ;
        local_528[0] = (uint)local_508[1];
        hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((insert_result *)&local_138[0].field_0,
                 (hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)local_408,local_528,(empty_type *)&local_5c8[0].field_0);
        uVar17 = uVar17 + 1;
        uVar13 = (ulong)this->m_num_blocks;
        lVar16 = lVar16 + 0x40;
        bVar9 = uVar17 >= uVar13;
      } while (uVar17 < uVar13);
    }
    this->m_max_selector_clusters = (uint)local_3f0 + 0x80;
    update_progress(this,1,1);
LAB_00137a9d:
    uVar18 = (uint)bVar9;
    if (afStack_404[1] != 0.0) {
      if (_local_408 != (raw_node *)0x0) {
        crnlib_free(_local_408);
        _local_408 = (raw_node *)0x0;
        afStack_404[1] = 0.0;
        afStack_404[2] = 0.0;
      }
      afStack_404[3] = 4.48416e-44;
      local_3f0._0_4_ = 0;
      local_3f0._4_4_ = 0;
    }
    if (_local_408 != (raw_node *)0x0) {
      crnlib_free(_local_408);
    }
  }
  return uVar18;
}

Assistant:

bool qdxt1::init(uint n, const dxt_pixel_block* pBlocks, const qdxt1_params& params)
    {
        clear();

        CRNLIB_ASSERT(n && pBlocks);

        m_main_thread_id = crn_get_current_thread_id();

        m_num_blocks = n;
        m_pBlocks = pBlocks;
        m_params = params;

        m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

        m_progress_start = 0;
        m_progress_range = 75;

        const bool debugging = false;
        image_u8 debug_img;

        if ((m_params.m_hierarchical) && (m_params.m_num_mips))
        {
            vec6F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
            training_vecs.resize(m_num_blocks);

            uint encoding_hist[cNumChunkEncodings];
            utils::zero_object(encoding_hist);

            uint total_processed_blocks = 0;
            uint next_progress_threshold = 512;

            for (uint level = 0; level < m_params.m_num_mips; level++)
            {
                const qdxt1_params::mip_desc& level_desc = m_params.m_mip_desc[level];

                const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
                const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

                const uint level_width = level_desc.m_block_width * 4;
                const uint level_height = level_desc.m_block_height * 4;

                if (debugging)
                {
                    debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);
                }

                float adaptive_tile_color_psnr_derating = 1.5f; // was 2.4f
                if ((level) && (adaptive_tile_color_psnr_derating > .25f))
                {
                    adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.1f, static_cast<float>(level))); // was 3.0f
                }
                for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++)
                {
                    for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++)
                    {
                        color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

                        for (uint y = 0; y < cChunkPixelHeight; y++)
                        {
                            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

                            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

                            for (uint x = 0; x < cChunkPixelWidth; x++)
                            {
                                const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

                                const uint block_index = outer_block_index + (pix_x >> 2);

                                const dxt_pixel_block& block = m_pBlocks[block_index];

                                const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

                                chunk_pixels[x + y * 8] = p;
                            }
                        }

                        struct layout_results
                        {
                            uint m_low_color;
                            uint m_high_color;
                            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
                            uint64 m_error;
                            //float m_penalty;
                        };
                        layout_results layouts[cNumChunkTileLayouts];

                        for (uint l = 0; l < cNumChunkTileLayouts; l++)
                        {
                            const uint width = g_chunk_tile_layouts[l].m_width;
                            const uint height = g_chunk_tile_layouts[l].m_height;
                            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
                            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

                            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
                            for (uint y = 0; y < height; y++)
                            {
                                for (uint x = 0; x < width; x++)
                                {
                                    layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];
                                }
                            }

                            const uint n = width * height;
                            dxt_fast::compress_color_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors);

                            color_quad_u8 c[4];
                            dxt1_block::get_block_colors(c, static_cast<uint16>(layouts[l].m_low_color), static_cast<uint16>(layouts[l].m_high_color));

                            uint64 error = 0;
                            for (uint i = 0; i < n; i++)
                            {
                                error += color::elucidian_distance(layout_pixels[i], c[layouts[l].m_selectors[i]], false);
                            }

                            layouts[l].m_error = error;

#if 0
                     if ((width > 4) || (height > 4))
                     {
                        const uint dist = color::elucidian_distance(
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_low_color), true),
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_high_color), true), false);

                        layouts[l].m_penalty = math::clamp((sqrt((float)dist) - 75.0f) / 150.0f, 0.0f, 2.0f);
                        if ((width == 8) && (height == 8))
                           layouts[l].m_penalty *= 2.0f;
                     }
                     else
                     {
                        layouts[l].m_penalty = 0.0f;
                     }
#endif
                        }

                        double best_peak_snr = -1.0f;
                        uint best_encoding = 0;

                        for (uint e = 0; e < cNumChunkEncodings; e++)
                        {
                            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

                            double total_error = 0;

                            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            {
                                total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;
                            }

                            //double mean_squared = total_error * (1.0f / (16.0f * 3.0f));
                            double mean_squared = total_error * (1.0f / (64.0f * 3.0f));
                            double root_mean_squared = sqrt(mean_squared);

                            double peak_snr = 999999.0f;
                            if (mean_squared)
                            {
                                peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);
                            }

                            //if (level)
                            //   adaptive_tile_color_psnr_derating = math::lerp(adaptive_tile_color_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));

                            float color_derating = math::lerp(0.0f, adaptive_tile_color_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
                            peak_snr = peak_snr - color_derating;

                            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

                            if (peak_snr > best_peak_snr)
                            {
                                best_peak_snr = peak_snr;
                                best_encoding = e;
                            }
                        }

                        encoding_hist[best_encoding]++;

                        const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

                        for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                        {
                            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

                            uint layout_index = tile_desc.m_layout_index;
                            const layout_results& layout = layouts[layout_index];
                            color_quad_u8 c[4];
                            if (debugging)
                            {
                                dxt1_block::get_block_colors(c, static_cast<uint16>(layout.m_low_color), static_cast<uint16>(layout.m_high_color));
                            }

                            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

                            for (uint y = 0; y < tile_desc.m_height; y++)
                            {
                                const uint pix_y = y + tile_desc.m_y_ofs;

                                for (uint x = 0; x < tile_desc.m_width; x++)
                                {
                                    const uint pix_x = x + tile_desc.m_x_ofs;

                                    tile_pixels[x + y * tile_desc.m_width] = chunk_pixels[pix_x + pix_y * cChunkPixelWidth];

                                    if (debugging)
                                    {
                                        debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
                                    }
                                }
                            }

                            color_quad_u8 l, h;
                            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

                            //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
                            const uint dist = color::elucidian_distance(l, h, false);

                            const uint cColorDistToWeight = 5000;
                            const uint cMaxWeight = 8;
                            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

                            vec6F ev;

                            ev[0] = l[0];
                            ev[1] = l[1];
                            ev[2] = l[2];
                            ev[3] = h[0];
                            ev[4] = h[1];
                            ev[5] = h[2];

                            for (uint y = 0; y < (tile_desc.m_height >> 2); y++)
                            {
                                uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
                                if (block_y >= level_desc.m_block_height)
                                {
                                    continue;
                                }

                                for (uint x = 0; x < (tile_desc.m_width >> 2); x++)
                                {
                                    uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                                    if (block_x >= level_desc.m_block_width)
                                    {
                                        break;
                                    }

                                    uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                                    training_vecs[block_index].first = ev;
                                    training_vecs[block_index].second = weight;

                                    total_processed_blocks++;

                                    //if (debugging)
                                    //{
                                    //   debug_img(block_x, block_y) = l;
                                    //   debug_img(block_x + level_desc.m_block_width, block_y) = h;
                                    //}

                                } // x
                            } // y
                        } //t

                        if (total_processed_blocks >= next_progress_threshold)
                        {
                            next_progress_threshold += 512;

                            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
                            {
                                return false;
                            }
                        }

                    } // chunk_x
                } // chunk_y

#if GENERATE_DEBUG_IMAGES
                if (debugging)
                    image_utils::write_to_file(dynamic_string(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

            } // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
        }
        else
        {
            for (uint block_index = 0; block_index < m_num_blocks; block_index++)
            {
                if ((block_index & 511) == 0)
                {
                    if (!update_progress(block_index, m_num_blocks - 1))
                    {
                        return false;
                    }
                }

                color_quad_u8 l, h;
                dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, &m_pBlocks[block_index].m_pixels[0][0], l, h);

                //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
                const uint dist = color::elucidian_distance(l, h, false);

                const uint cColorDistToWeight = 5000;
                const uint cMaxWeight = 8;
                uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

                vec6F ev;

                ev[0] = l[0];
                ev[1] = l[1];
                ev[2] = l[2];
                ev[3] = h[0];
                ev[4] = h[1];
                ev[5] = h[2];

                m_endpoint_clusterizer.add_training_vec(ev, weight);
            }
        }

        const uint cMaxEndpointClusters = 65535U;

        m_progress_start = 75;
        m_progress_range = 20;

        if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
        {
            return false;
        }

        crnlib::hash_map<uint, empty_type> selector_hash;

        m_progress_start = 95;
        m_progress_range = 5;

        for (uint block_index = 0; block_index < m_num_blocks; block_index++)
        {
            if ((block_index & 511) == 0)
            {
                if (!update_progress(block_index, m_num_blocks - 1))
                {
                    return false;
                }
            }

            dxt1_block dxt_blk;
            dxt_fast::compress_color_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0]);

            uint selectors = dxt_blk.m_selectors[0] | (dxt_blk.m_selectors[1] << 8) | (dxt_blk.m_selectors[2] << 16) | (dxt_blk.m_selectors[3] << 24);

            selector_hash.insert(selectors);
        }

        m_max_selector_clusters = selector_hash.size() + 128;

        //      trace("max endpoint clusters: %u\n", m_endpoint_clusterizer.get_codebook_size());
        //      trace("max selector clusters: %u\n", m_max_selector_clusters);

        update_progress(1, 1);

        return true;
    }